

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O0

void __thiscall
vk::BinaryRegistryDetail::BinaryRegistryWriter::~BinaryRegistryWriter(BinaryRegistryWriter *this)

{
  ProgramBinary *this_00;
  bool bVar1;
  pointer pBVar2;
  __normal_iterator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot_*,_std::vector<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot,_std::allocator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot>_>_>
  local_28;
  __normal_iterator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot_*,_std::vector<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot,_std::allocator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot>_>_>
  local_20;
  __normal_iterator<const_vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot_*,_std::vector<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot,_std::allocator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot>_>_>
  local_18;
  const_iterator binaryIter;
  BinaryRegistryWriter *this_local;
  
  binaryIter._M_current = (BinarySlot *)this;
  local_20._M_current =
       (BinarySlot *)
       std::
       vector<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot,_std::allocator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot>_>
       ::begin(&this->m_binaries);
  __gnu_cxx::
  __normal_iterator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot_const*,std::vector<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot,std::allocator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot>>>
  ::__normal_iterator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot*>
            ((__normal_iterator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot_const*,std::vector<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot,std::allocator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot>>>
              *)&local_18,&local_20);
  while( true ) {
    local_28._M_current =
         (BinarySlot *)
         std::
         vector<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot,_std::allocator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot>_>
         ::end(&this->m_binaries);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    pBVar2 = __gnu_cxx::
             __normal_iterator<const_vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot_*,_std::vector<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot,_std::allocator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot>_>_>
             ::operator->(&local_18);
    this_00 = pBVar2->binary;
    if (this_00 != (ProgramBinary *)0x0) {
      ProgramBinary::~ProgramBinary(this_00);
      operator_delete(this_00,0x20);
    }
    __gnu_cxx::
    __normal_iterator<const_vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot_*,_std::vector<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot,_std::allocator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot>_>_>
    ::operator++(&local_18);
  }
  std::
  vector<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot,_std::allocator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot>_>
  ::~vector(&this->m_binaries);
  BinaryIndexHash::~BinaryIndexHash(&this->m_binaryHash);
  std::
  vector<vk::BinaryRegistryDetail::ProgramIdentifierIndex,_std::allocator<vk::BinaryRegistryDetail::ProgramIdentifierIndex>_>
  ::~vector(&this->m_binaryIndices);
  return;
}

Assistant:

BinaryRegistryWriter::~BinaryRegistryWriter (void)
{
	for (BinaryVector::const_iterator binaryIter = m_binaries.begin();
		 binaryIter != m_binaries.end();
		 ++binaryIter)
		delete binaryIter->binary;
}